

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpge.cpp
# Opt level: O0

void __thiscall jpge::jpeg_encoder::emit_sos(jpeg_encoder *this)

{
  long in_RDI;
  int i;
  uint i_00;
  uint8 i_01;
  uint in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar1;
  
  i_00 = (uint)((ulong)in_RDI >> 0x20);
  emit_marker((jpeg_encoder *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),i_00);
  emit_word((jpeg_encoder *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),i_00);
  i_01 = (uint8)((ulong)in_RDI >> 0x38);
  emit_byte((jpeg_encoder *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),i_01);
  for (iVar1 = 0; iVar1 < (int)(uint)*(byte *)(in_RDI + 0x14); iVar1 = iVar1 + 1) {
    emit_byte((jpeg_encoder *)CONCAT44(iVar1,in_stack_fffffffffffffff0),i_01);
    if (iVar1 == 0) {
      emit_byte((jpeg_encoder *)(ulong)in_stack_fffffffffffffff0,i_01);
    }
    else {
      emit_byte((jpeg_encoder *)CONCAT44(iVar1,in_stack_fffffffffffffff0),i_01);
    }
  }
  emit_byte((jpeg_encoder *)CONCAT44(iVar1,in_stack_fffffffffffffff0),i_01);
  emit_byte((jpeg_encoder *)CONCAT44(iVar1,in_stack_fffffffffffffff0),i_01);
  emit_byte((jpeg_encoder *)CONCAT44(iVar1,in_stack_fffffffffffffff0),i_01);
  return;
}

Assistant:

void jpeg_encoder::emit_sos() {
  emit_marker(M_SOS);
  emit_word(2 * m_num_components + 2 + 1 + 3);
  emit_byte(m_num_components);
  for (int i = 0; i < m_num_components; i++) {
    emit_byte(static_cast<uint8>(i + 1));
    if (i == 0)
      emit_byte((0 << 4) + 0);
    else
      emit_byte((1 << 4) + 1);
  }
  emit_byte(0); /* spectral selection */
  emit_byte(63);
  emit_byte(0);
}